

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.h
# Opt level: O2

cmCommand * __thiscall cmConfigureFileCommand::Clone(cmConfigureFileCommand *this)

{
  cmConfigureFileCommand *this_00;
  
  this_00 = (cmConfigureFileCommand *)operator_new(0x80);
  cmConfigureFileCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmConfigureFileCommand; }